

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splaygetbest(curltime i,Curl_tree *t,Curl_tree **removed)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  Curl_tree *pCVar4;
  Curl_tree *pCVar5;
  Curl_tree *pCVar6;
  
  if (t == (Curl_tree *)0x0) {
    pCVar6 = (Curl_tree *)0x0;
    pCVar5 = (Curl_tree *)0x0;
  }
  else {
    pCVar4 = Curl_splay((curltime)ZEXT816(0),t);
    lVar1 = (pCVar4->key).tv_sec;
    pCVar5 = pCVar4;
    pCVar6 = (Curl_tree *)0x0;
    if (lVar1 <= i.tv_sec) {
      if ((lVar1 < i.tv_sec) || ((pCVar4->key).tv_usec <= i.tv_usec)) {
        pCVar5 = pCVar4->samen;
        pCVar6 = pCVar4;
        if (pCVar5 == pCVar4) {
          pCVar5 = pCVar4->larger;
        }
        else {
          iVar2 = (pCVar4->key).tv_usec;
          uVar3 = *(undefined4 *)&(pCVar4->key).field_0xc;
          (pCVar5->key).tv_sec = (pCVar4->key).tv_sec;
          (pCVar5->key).tv_usec = iVar2;
          *(undefined4 *)&(pCVar5->key).field_0xc = uVar3;
          pCVar5->larger = pCVar4->larger;
          pCVar5->smaller = pCVar4->smaller;
          pCVar5->samep = pCVar4->samep;
          pCVar4->samep->samen = pCVar5;
        }
      }
      else {
        pCVar6 = (Curl_tree *)0x0;
      }
    }
  }
  *removed = pCVar6;
  return pCVar5;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct curltime i,
                                    struct Curl_tree *t,
                                    struct Curl_tree **removed)
{
  static const struct curltime tv_zero = {0, 0};
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  /* find smallest */
  t = Curl_splay(tv_zero, t);
  if(compare(i, t->key) < 0) {
    /* even the smallest is too big */
    *removed = NULL;
    return t;
  }

  /* FIRST! Check if there is a list with identical keys */
  x = t->samen;
  if(x != t) {
    /* there is, pick one from the list */

    /* 'x' is the new root node */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;

    *removed = t;
    return x; /* new root */
  }

  /* we splayed the tree to the smallest element, there is no smaller */
  x = t->larger;
  *removed = t;

  return x;
}